

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HLSL2GLSLConverterImpl.cpp
# Opt level: O1

String * __thiscall
Diligent::HLSL2GLSLConverterImpl::ConversionStream::BuildGLSLSource_abi_cxx11_
          (String *__return_storage_ptr__,ConversionStream *this)

{
  _List_node_base *p_Var1;
  uint uVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  for (p_Var1 = (this->m_Tokens).
                super__List_base<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>
                ._M_impl._M_node.super__List_node_base._M_next;
      p_Var1 != (_List_node_base *)&this->m_Tokens; p_Var1 = p_Var1->_M_next) {
    uVar2 = *(int *)&p_Var1[1]._M_next - 0xd2;
    if ((0x39 < uVar2) || ((0x200000640000001U >> ((ulong)uVar2 & 0x3f) & 1) == 0)) {
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)p_Var1[3]._M_prev);
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)p_Var1[1]._M_prev);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

String HLSL2GLSLConverterImpl::ConversionStream::BuildGLSLSource()
{
    String Output;
    for (const auto& Token : m_Tokens)
    {
        if ((Token.Type == TokenType::kw_linear ||
             Token.Type == TokenType::kw_nointerpolation ||
             Token.Type == TokenType::kw_noperspective ||
             Token.Type == TokenType::kw_centroid ||
             Token.Type == TokenType::kw_sample))
        {
            // Skip interpolation qualifiers.
            // We may get here if there are multiple shader functions in the same file.
            continue;
        }

        Output.append(Token.Delimiter);
        Output.append(Token.Literal);
    }
    return Output;
}